

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

void vocsetfd(voccxdef *ctx,vocddef *what,objnum func,prpnum prop,uint tm,runsdef *val,int err)

{
  runsdef *val_local;
  uint tm_local;
  prpnum prop_local;
  objnum func_local;
  vocddef *what_local;
  voccxdef *ctx_local;
  
  return;
}

Assistant:

void vocsetfd(voccxdef *ctx, vocddef *what, objnum func, prpnum prop,
              uint tm, runsdef *val, int err)
{
    VARUSED(ctx);
    VARUSED(what);
    VARUSED(func);
    VARUSED(prop);
    VARUSED(tm);
    VARUSED(val);
    VARUSED(err);
}